

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_t.cpp
# Opt level: O0

number_t * __thiscall deci::number_t::ToText_abi_cxx11_(number_t *this)

{
  long in_RSI;
  allocator local_59;
  char local_58 [8];
  char buffer [64];
  number_t *this_local;
  
  snprintf(local_58,0x40,"%.*g",*(undefined8 *)(in_RSI + 0x10),0x15);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,local_58,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return this;
}

Assistant:

std::string number_t::ToText() const {
    char buffer[64];
    snprintf(buffer, sizeof(buffer), "%.*g", DECIMAL_DIG, this->val);
    return std::string(buffer);
  }